

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

shared_ptr<kratos::IfStmt> __thiscall
kratos::RemoveEmptyBlockVisitor::process
          (RemoveEmptyBlockVisitor *this,shared_ptr<kratos::IfStmt> *stmt)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  element_type *peVar2;
  shared_ptr<kratos::ScopedStmtBlock> *psVar3;
  element_type *this_01;
  element_type *this_02;
  __shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<kratos::IfStmt> sVar4;
  undefined1 local_e0 [32];
  shared_ptr<kratos::ScopedStmtBlock> local_c0;
  enable_shared_from_this<kratos::Var> local_b0;
  undefined8 local_a0;
  Expr *new_cond;
  shared_ptr<kratos::Var> cond;
  shared_ptr<kratos::StmtBlock> local_80;
  undefined1 local_70 [8];
  shared_ptr<kratos::StmtBlock> else_body;
  shared_ptr<kratos::StmtBlock> local_50;
  undefined1 local_40 [8];
  shared_ptr<kratos::StmtBlock> then_body;
  shared_ptr<kratos::ScopedStmtBlock> then_;
  shared_ptr<kratos::IfStmt> *stmt_local;
  RemoveEmptyBlockVisitor *this_local;
  
  peVar2 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDX);
  psVar3 = IfStmt::then_body(peVar2);
  this_00 = &then_body.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ;
  std::shared_ptr<kratos::ScopedStmtBlock>::shared_ptr
            ((shared_ptr<kratos::ScopedStmtBlock> *)this_00,psVar3);
  std::shared_ptr<kratos::StmtBlock>::shared_ptr<kratos::ScopedStmtBlock,void>
            (&local_50,(shared_ptr<kratos::ScopedStmtBlock> *)this_00);
  process((RemoveEmptyBlockVisitor *)local_40,(shared_ptr<kratos::StmtBlock> *)stmt);
  std::shared_ptr<kratos::StmtBlock>::~shared_ptr(&local_50);
  peVar2 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDX);
  psVar3 = IfStmt::else_body(peVar2);
  std::shared_ptr<kratos::StmtBlock>::shared_ptr<kratos::ScopedStmtBlock,void>(&local_80,psVar3);
  process((RemoveEmptyBlockVisitor *)local_70,(shared_ptr<kratos::StmtBlock> *)stmt);
  std::shared_ptr<kratos::StmtBlock>::~shared_ptr(&local_80);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(in_RDX);
    std::__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               local_40);
    Stmt::as<kratos::ScopedStmtBlock>((Stmt *)local_e0);
    IfStmt::set_then(peVar2,(shared_ptr<kratos::ScopedStmtBlock> *)local_e0);
    std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr
              ((shared_ptr<kratos::ScopedStmtBlock> *)local_e0);
    std::shared_ptr<kratos::IfStmt>::shared_ptr
              ((shared_ptr<kratos::IfStmt> *)this,(shared_ptr<kratos::IfStmt> *)in_RDX);
    cond.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1;
  }
  else {
    this_01 = std::__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_70);
    bVar1 = StmtBlock::empty(this_01);
    if (bVar1) {
      std::shared_ptr<kratos::IfStmt>::shared_ptr((shared_ptr<kratos::IfStmt> *)this,(nullptr_t)0x0)
      ;
      cond.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1;
    }
    else {
      std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                (in_RDX);
      IfStmt::predicate((IfStmt *)&new_cond);
      this_02 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator*((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&new_cond);
      local_a0 = Var::operator~(this_02);
      peVar2 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(in_RDX);
      std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_b0);
      IfStmt::set_predicate(peVar2,(shared_ptr<kratos::Var> *)&local_b0);
      std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_b0);
      peVar2 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(in_RDX);
      std::__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )local_70);
      Stmt::as<kratos::ScopedStmtBlock>((Stmt *)&local_c0);
      IfStmt::set_then(peVar2,&local_c0);
      std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr(&local_c0);
      peVar2 = std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(in_RDX);
      std::make_shared<kratos::ScopedStmtBlock>();
      IfStmt::set_else(peVar2,(shared_ptr<kratos::ScopedStmtBlock> *)(local_e0 + 0x10));
      std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr
                ((shared_ptr<kratos::ScopedStmtBlock> *)(local_e0 + 0x10));
      std::shared_ptr<kratos::IfStmt>::shared_ptr
                ((shared_ptr<kratos::IfStmt> *)this,(shared_ptr<kratos::IfStmt> *)in_RDX);
      cond.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1;
      std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&new_cond);
    }
  }
  std::shared_ptr<kratos::StmtBlock>::~shared_ptr((shared_ptr<kratos::StmtBlock> *)local_70);
  std::shared_ptr<kratos::StmtBlock>::~shared_ptr((shared_ptr<kratos::StmtBlock> *)local_40);
  std::shared_ptr<kratos::ScopedStmtBlock>::~shared_ptr
            ((shared_ptr<kratos::ScopedStmtBlock> *)
             &then_body.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  sVar4.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<kratos::IfStmt>)
         sVar4.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<IfStmt> process(std::shared_ptr<IfStmt> stmt) {
        auto then_ = stmt->then_body();
        auto then_body = process(then_);
        auto else_body = process(stmt->else_body());
        if (!then_body) {
            // then is empty
            if (else_body->empty()) {
                return nullptr;
            } else {
                // invert the condition and make else then
                auto cond = stmt->predicate();
                auto& new_cond = ~(*cond);
                stmt->set_predicate(new_cond.shared_from_this());
                stmt->set_then(else_body->as<ScopedStmtBlock>());
                stmt->set_else(std::make_shared<ScopedStmtBlock>());
                return stmt;
            }
        }
        stmt->set_then(then_body->as<ScopedStmtBlock>());
        return stmt;
    }